

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int lyd_print_file(FILE *f,lyd_node *root,LYD_FORMAT format,int options)

{
  int iVar1;
  LY_ERR *pLVar2;
  undefined1 local_28 [8];
  lyout out;
  
  if (f == (FILE *)0x0) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    iVar1 = 1;
  }
  else {
    local_28._0_4_ = LYOUT_STREAM;
    out._0_8_ = f;
    iVar1 = lyd_print_((lyout *)local_28,root,format,options);
  }
  return iVar1;
}

Assistant:

API int
lyd_print_file(FILE *f, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    struct lyout out;

    if (!f) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    out.type = LYOUT_STREAM;
    out.method.f = f;

    return lyd_print_(&out, root, format, options);
}